

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter-basic.c
# Opt level: O3

int next_concat(hd_context *ctx,hd_stream *stm,size_t max)

{
  int iVar1;
  void *pvVar2;
  byte *pbVar3;
  size_t sVar4;
  hd_stream *phVar5;
  
  pvVar2 = stm->state;
  do {
    iVar1 = *(int *)((long)pvVar2 + 8);
    if (*(int *)((long)pvVar2 + 4) <= iVar1) {
LAB_00112f7f:
      stm->rp = stm->wp;
      return -1;
    }
    phVar5 = *(hd_stream **)((long)pvVar2 + (long)iVar1 * 8 + 0x18);
    if (stm->wp == phVar5->wp) {
      phVar5->rp = stm->wp;
      phVar5 = *(hd_stream **)((long)pvVar2 + (long)iVar1 * 8 + 0x18);
    }
    sVar4 = hd_available(ctx,phVar5,max);
    iVar1 = *(int *)((long)pvVar2 + 8);
    phVar5 = *(hd_stream **)((long)pvVar2 + (long)iVar1 * 8 + 0x18);
    if (sVar4 != 0) {
      pbVar3 = phVar5->rp;
      stm->rp = pbVar3;
      stm->wp = *(uchar **)(*(long *)((long)pvVar2 + (long)iVar1 * 8 + 0x18) + 0x20);
      stm->pos = stm->pos + (int)sVar4;
      stm->rp = pbVar3 + 1;
      return (uint)*pbVar3;
    }
    if (phVar5->error != 0) {
      stm->error = 1;
      goto LAB_00112f7f;
    }
    *(int *)((long)pvVar2 + 8) = iVar1 + 1;
    hd_drop_stream(ctx,phVar5);
    if (*(int *)((long)pvVar2 + 0xc) != 0) {
      stm->rp = (uchar *)((long)pvVar2 + 0x11);
      stm->wp = (uchar *)((long)pvVar2 + 0x12);
      stm->pos = stm->pos + 1;
      return 0x20;
    }
  } while( true );
}

Assistant:

static int
next_concat(hd_context *ctx, hd_stream *stm, size_t max)
{
    struct concat_filter *state = (struct concat_filter *)stm->state;
    size_t n;

    while (state->current < state->count)
    {
        /* Read the next block of underlying data. */
        if (stm->wp == state->chain[state->current]->wp)
            state->chain[state->current]->rp = stm->wp;
        n = hd_available(ctx, state->chain[state->current], max);
        if (n)
        {
            stm->rp = state->chain[state->current]->rp;
            stm->wp = state->chain[state->current]->wp;
            stm->pos += (int64_t)n;
            return *stm->rp++;
        }
        else
        {
            if (state->chain[state->current]->error)
            {
                stm->error = 1;
                break;
            }
            state->current++;
            hd_drop_stream(ctx, state->chain[state->current-1]);
            if (state->pad)
            {
                stm->rp = (&state->ws_buf)+1;
                stm->wp = stm->rp + 1;
                stm->pos++;
                return 32;
            }
        }
    }

    stm->rp = stm->wp;

    return EOF;
}